

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O3

void Dsd_TreeGetInfo_rec(Dsd_Node_t *pNode,int RankCur)

{
  int iVar1;
  long lVar2;
  
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0xd9,"void Dsd_TreeGetInfo_rec(Dsd_Node_t *, int)");
  }
  if (((ulong)pNode & 1) == 0) {
    if (-1 < pNode->nVisits) {
      iVar1 = 2;
      if (1 < pNode->Type - DSD_NODE_OR) {
        iVar1 = (int)pNode->nDecs;
      }
      if (s_GateSizeMax < iVar1) {
        s_GateSizeMax = iVar1;
      }
      if (1 < pNode->nDecs) {
        if (s_DepthMax <= RankCur) {
          s_DepthMax = RankCur + 1;
        }
        lVar2 = 0;
        do {
          Dsd_TreeGetInfo_rec((Dsd_Node_t *)((ulong)pNode->pDecs[lVar2] & 0xfffffffffffffffe),
                              RankCur + 1);
          lVar2 = lVar2 + 1;
        } while (lVar2 < pNode->nDecs);
      }
      return;
    }
    __assert_fail("pNode->nVisits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0xdb,"void Dsd_TreeGetInfo_rec(Dsd_Node_t *, int)");
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                ,0xda,"void Dsd_TreeGetInfo_rec(Dsd_Node_t *, int)");
}

Assistant:

void Dsd_TreeGetInfo_rec( Dsd_Node_t * pNode, int RankCur )
{
    int i;
    int GateSize;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );
    assert( pNode->nVisits >= 0 );

    // we don't want the two-input gates to count for non-decomposable blocks
    if ( pNode->Type == DSD_NODE_OR  || 
         pNode->Type == DSD_NODE_EXOR )
        GateSize = 2;
    else
        GateSize = pNode->nDecs;

    // update the max size of the node
    if ( s_GateSizeMax < GateSize )
         s_GateSizeMax = GateSize;

    if ( pNode->nDecs < 2 )
        return;

    // update the max rank
    if ( s_DepthMax < RankCur+1 )
         s_DepthMax = RankCur+1;

    // call recursively
    for ( i = 0; i < pNode->nDecs; i++ )
        Dsd_TreeGetInfo_rec( Dsd_Regular(pNode->pDecs[i]), RankCur+1 );
}